

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operators.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::
op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
::diff(op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
       *this,rt_expression_interface<double> *e,rt_expression_interface<double> *diff_var)

{
  rt_expression_interface<double> *prVar1;
  op_rt_integral<viennamath::rt_expression_interface<double>_> local_40;
  rt_expression_interface<double> *local_20;
  rt_expression_interface<double> *diff_var_local;
  rt_expression_interface<double> *e_local;
  op_unary<viennamath::op_rt_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
  *this_local;
  
  local_20 = diff_var;
  diff_var_local = e;
  e_local = (rt_expression_interface<double> *)this;
  op_rt_integral<viennamath::rt_expression_interface<double>_>::op_rt_integral
            (&local_40,&this->unary_op_);
  prVar1 = diff_impl<viennamath::rt_expression_interface<double>>(e,&local_40,local_20);
  op_rt_integral<viennamath::rt_expression_interface<double>_>::~op_rt_integral(&local_40);
  return prVar1;
}

Assistant:

InterfaceType * diff(const InterfaceType * e,
                           const InterfaceType * diff_var) const
      {
        return diff_impl(e, unary_op_, diff_var);
      }